

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncInfo.cpp
# Opt level: O0

void __thiscall
FuncInfo::FuncInfo(FuncInfo *this,char16 *name,ArenaAllocator *alloc,
                  ByteCodeGenerator *byteCodeGenerator,Scope *paramScope,Scope *bodyScope,
                  ParseNodeFnc *pnode,ParseableFunctionInfo *byteCodeFunction)

{
  bool bVar1;
  Attributes AVar2;
  Scope *bodyScope_local;
  Scope *paramScope_local;
  ByteCodeGenerator *byteCodeGenerator_local;
  ArenaAllocator *alloc_local;
  char16 *name_local;
  FuncInfo *this_local;
  
  this->inlineCacheCount = 0;
  this->rootObjectLoadInlineCacheCount = 0;
  this->rootObjectLoadMethodInlineCacheCount = 0;
  this->rootObjectStoreInlineCacheCount = 0;
  this->isInstInlineCacheCount = 0;
  this->referencedPropertyIdCount = 0;
  this->currentChildFunction = (FuncInfo *)0x0;
  this->currentChildScope = (Scope *)0x0;
  this->capturedSyms = (SymbolTable *)0x0;
  this->capturedSymMap = (CapturedSymMap *)0x0;
  this->nextForInLoopLevel = 0;
  this->maxForInLoopLevel = 0;
  this->alloc = alloc;
  this->varRegsCount = 0;
  this->constRegsCount = 2;
  this->inArgsCount = 0;
  this->outArgsMaxDepth = 0;
  this->outArgsCurrentExpr = 0;
  this->innerScopeCount = 0;
  this->currentInnerScopeIndex = 0xffffffff;
  this->outArgsDepth = 0;
  this->name = name;
  this->nullConstantRegister = 0xffffffff;
  this->undefinedConstantRegister = 0xffffffff;
  this->trueConstantRegister = 0xffffffff;
  this->falseConstantRegister = 0xffffffff;
  this->thisConstantRegister = 0xffffffff;
  this->envRegister = 0xffffffff;
  this->frameObjRegister = 0xffffffff;
  this->frameSlotsRegister = 0xffffffff;
  this->paramSlotsRegister = 0xffffffff;
  this->frameDisplayRegister = 0xffffffff;
  this->funcObjRegister = 0xffffffff;
  this->localClosureReg = 0xffffffff;
  this->awaitRegister = 0xffffffff;
  this->yieldRegister = 0xffffffff;
  this->firstTmpReg = 0xffffffff;
  this->curTmpReg = 0xffffffff;
  this->argsPlaceHolderSlotCount = 0;
  this->field_0xb4 = this->field_0xb4 & 0xfe;
  this->field_0xb4 = this->field_0xb4 & 0xfd;
  this->field_0xb4 = this->field_0xb4 & 0xfb;
  this->field_0xb4 = this->field_0xb4 & 0xf7;
  this->field_0xb4 = this->field_0xb4 & 0xef;
  this->field_0xb4 = this->field_0xb4 & 0xdf;
  this->field_0xb4 = this->field_0xb4 & 0xbf;
  this->field_0xb4 = this->field_0xb4 & 0x7f;
  this->field_0xb5 = this->field_0xb5 & 0xfe;
  this->field_0xb5 = this->field_0xb5 & 0xfd;
  this->field_0xb5 = this->field_0xb5 & 0xfb;
  this->field_0xb5 = this->field_0xb5 & 0xf7;
  this->field_0xb5 = this->field_0xb5 & 0xef;
  this->field_0xb5 = this->field_0xb5 & 0xdf;
  this->field_0xb5 = this->field_0xb5 & 0xbf;
  this->field_0xb5 = this->field_0xb5 | 0x80;
  this->field_0xb6 = this->field_0xb6 & 0xfe;
  JsUtil::
  BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(&this->constantToRegister,alloc,0x11);
  JsUtil::
  BaseDictionary<Ident_*,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(&this->stringToRegister,alloc,0x11);
  JsUtil::
  BaseDictionary<double,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(&this->doubleConstantToRegister,alloc,0x11);
  JsUtil::
  BaseDictionary<ParseNode_*,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(&this->bigintToRegister,alloc,0x11);
  JsUtil::
  BaseDictionary<ParseNode_*,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(&this->stringTemplateCallsiteRegisterMap,alloc,0x11);
  this->paramScope = paramScope;
  this->bodyScope = bodyScope;
  this->funcExprScope = (Scope *)0x0;
  this->root = pnode;
  this->byteCodeFunction = byteCodeFunction;
  SList<ParseNodeStmt_*,_Memory::ArenaAllocator,_RealCount>::SList(&this->targetStatements,alloc);
  this->singleExit = 0;
  this->rootObjectLoadInlineCacheMap = (RootObjectInlineCacheIdMap *)0x0;
  this->rootObjectLoadMethodInlineCacheMap = (RootObjectInlineCacheIdMap *)0x0;
  this->rootObjectStoreInlineCacheMap = (RootObjectInlineCacheIdMap *)0x0;
  this->inlineCacheMap = (InlineCacheMap *)0x0;
  this->referencedPropertyIdToMapIndex = (ReferencedPropertyIdMap *)0x0;
  this->callSiteToCallApplyCallSiteMap = (CallSiteToCallApplyCallSiteMap *)0x0;
  SListBase<unsigned_int,_Memory::ArenaAllocator,_RealCount>::SListBase(&this->valueOfStoreCacheIds)
  ;
  SListBase<unsigned_int,_Memory::ArenaAllocator,_RealCount>::SListBase
            (&this->toStringStoreCacheIds);
  JsUtil::
  BaseDictionary<FuncInfo::SlotKey,_unsigned_short,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_FuncInfo::SlotKeyComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(&this->slotProfileIdMap,alloc,0);
  this->argumentsSymbol = (Symbol *)0x0;
  this->thisSymbol = (Symbol *)0x0;
  this->newTargetSymbol = (Symbol *)0x0;
  this->importMetaSymbol = (Symbol *)0x0;
  this->superSymbol = (Symbol *)0x0;
  this->superConstructorSymbol = (Symbol *)0x0;
  JsUtil::List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
  List(&this->nonUserNonTempRegistersToInitialize,alloc,4);
  if (bodyScope != (Scope *)0x0) {
    Scope::SetFunc(bodyScope,this);
  }
  if (paramScope != (Scope *)0x0) {
    Scope::SetFunc(paramScope,this);
  }
  if ((pnode != (ParseNodeFnc *)0x0) && (bVar1 = ParseNodeFnc::NestedFuncEscapes(pnode), bVar1)) {
    SetHasMaybeEscapedNestedFunc(this,L"Child");
  }
  if (((byteCodeFunction != (ParseableFunctionInfo *)0x0) &&
      (bVar1 = Js::FunctionProxy::IsDeferred(&byteCodeFunction->super_FunctionProxy), !bVar1)) &&
     (bVar1 = Js::FunctionProxy::CanBeDeferred(&byteCodeFunction->super_FunctionProxy), bVar1)) {
    AVar2 = Js::FunctionProxy::GetAttributes(&byteCodeFunction->super_FunctionProxy);
    *(Attributes *)&this->field_0xb4 = *(uint *)&this->field_0xb4 & 0xfffffffe | AVar2 >> 0x13 & 1;
    ByteCodeGenerator::AddFuncInfoToFinalizationSet(byteCodeGenerator,this);
    AVar2 = Js::FunctionProxy::GetAttributes(&byteCodeFunction->super_FunctionProxy);
    Js::FunctionProxy::SetAttributes(&byteCodeFunction->super_FunctionProxy,AVar2 & ~CanDefer);
  }
  return;
}

Assistant:

FuncInfo::FuncInfo(
    const char16 *name,
    ArenaAllocator *alloc,
    ByteCodeGenerator *byteCodeGenerator,
    Scope *paramScope,
    Scope *bodyScope,
    ParseNodeFnc *pnode,
    Js::ParseableFunctionInfo* byteCodeFunction)
    :
    inlineCacheCount(0),
    rootObjectLoadInlineCacheCount(0),
    rootObjectLoadMethodInlineCacheCount(0),
    rootObjectStoreInlineCacheCount(0),
    isInstInlineCacheCount(0),
    referencedPropertyIdCount(0),
    currentChildFunction(nullptr),
    currentChildScope(nullptr),
    capturedSyms(nullptr),
    capturedSymMap(nullptr),
    nextForInLoopLevel(0),
    maxForInLoopLevel(0),
    alloc(alloc),
    varRegsCount(0),
    constRegsCount(InitialConstRegsCount),
    inArgsCount(0),
    outArgsMaxDepth(0),
    outArgsCurrentExpr(0),
    innerScopeCount(0),
    currentInnerScopeIndex((uint)-1),
#if DBG
    outArgsDepth(0),
#endif
    name(name),
    nullConstantRegister(Js::Constants::NoRegister),
    undefinedConstantRegister(Js::Constants::NoRegister),
    trueConstantRegister(Js::Constants::NoRegister),
    falseConstantRegister(Js::Constants::NoRegister),
    thisConstantRegister(Js::Constants::NoRegister),
    envRegister(Js::Constants::NoRegister),
    frameObjRegister(Js::Constants::NoRegister),
    frameSlotsRegister(Js::Constants::NoRegister),
    paramSlotsRegister(Js::Constants::NoRegister),
    frameDisplayRegister(Js::Constants::NoRegister),
    funcObjRegister(Js::Constants::NoRegister),
    localClosureReg(Js::Constants::NoRegister),
    awaitRegister(Js::Constants::NoRegister),
    yieldRegister(Js::Constants::NoRegister),
    firstTmpReg(Js::Constants::NoRegister),
    curTmpReg(Js::Constants::NoRegister),
    argsPlaceHolderSlotCount(0),

    canDefer(false),
    callsEval(false),
    childCallsEval(false),
    hasArguments(false),
    hasHeapArguments(false),
    isTopLevelEventHandler(false),
    hasLocalInClosure(false),
    hasClosureReference(false),
    hasCachedScope(false),
    funcExprNameReference(false),
    applyEnclosesArgs(false),
    escapes(false),
    hasLoop(false),
    hasEscapedUseNestedFunc(false),
    needEnvRegister(false),
    isBodyAndParamScopeMerged(true),
#if DBG
    isReused(false),
#endif

    constantToRegister(alloc, 17),
    stringToRegister(alloc, 17),
    bigintToRegister(alloc, 17),
    doubleConstantToRegister(alloc, 17),
    stringTemplateCallsiteRegisterMap(alloc, 17),

    paramScope(paramScope),
    bodyScope(bodyScope),
    funcExprScope(nullptr),
    root(pnode),
    byteCodeFunction(byteCodeFunction),
    targetStatements(alloc),
    singleExit(0),
    rootObjectLoadInlineCacheMap(nullptr),
    rootObjectLoadMethodInlineCacheMap(nullptr),
    rootObjectStoreInlineCacheMap(nullptr),
    inlineCacheMap(nullptr),
    referencedPropertyIdToMapIndex(nullptr),
    callSiteToCallApplyCallSiteMap(nullptr),
    valueOfStoreCacheIds(),
    toStringStoreCacheIds(),
    slotProfileIdMap(alloc),
    argumentsSymbol(nullptr),
    thisSymbol(nullptr),
    newTargetSymbol(nullptr),
    superSymbol(nullptr),
    superConstructorSymbol(nullptr),
    importMetaSymbol(nullptr),
    nonUserNonTempRegistersToInitialize(alloc)
{
    if (bodyScope != nullptr)
    {
        bodyScope->SetFunc(this);
    }
    if (paramScope != nullptr)
    {
        paramScope->SetFunc(this);
    }
    if (pnode && pnode->NestedFuncEscapes())
    {
        this->SetHasMaybeEscapedNestedFunc(DebugOnly(_u("Child")));
    }

    if (byteCodeFunction && !byteCodeFunction->IsDeferred() && byteCodeFunction->CanBeDeferred())
    {
        // Disable (re-)deferral of this function temporarily. Add it to the list of FuncInfo's to be processed when 
        // byte code gen is done.
        this->canDefer = !!(byteCodeFunction->GetAttributes() & Js::FunctionInfo::Attributes::CanDefer);
        byteCodeGenerator->AddFuncInfoToFinalizationSet(this);
        byteCodeFunction->SetAttributes((Js::FunctionInfo::Attributes)(byteCodeFunction->GetAttributes() & ~Js::FunctionInfo::Attributes::CanDefer));
    }
}